

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O0

exr_result_t
exr_decoding_initialize
          (exr_const_context_t ctxt,int part_index,exr_chunk_info_t *cinfo,
          exr_decode_pipeline_t *decode)

{
  long lVar1;
  void *in_RCX;
  void *in_RDX;
  int in_ESI;
  long in_RDI;
  exr_const_priv_part_t part;
  exr_decode_pipeline_t nil;
  exr_result_t rv;
  undefined1 local_228 [24];
  exr_const_priv_part_t in_stack_fffffffffffffdf0;
  exr_const_context_t in_stack_fffffffffffffdf8;
  exr_chunk_info_t *in_stack_fffffffffffffe00;
  exr_coding_channel_info_t *in_stack_fffffffffffffe08;
  int16_t *in_stack_fffffffffffffe10;
  exr_coding_channel_info_t **in_stack_fffffffffffffe18;
  exr_result_t local_4;
  
  memset(local_228,0,0x1f8);
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else if ((in_RDX == (void *)0x0) || (in_RCX == (void *)0x0)) {
    local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
  }
  else if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
    local_4 = 4;
  }
  else {
    lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
    memcpy(in_RCX,local_228,0x1f8);
    if ((((*(int *)(lVar1 + 4) == 2) || (*(int *)(lVar1 + 4) == 3)) &&
        (*(long *)(lVar1 + 0x78) != 0)) && (*(int *)(*(long *)(lVar1 + 0x78) + 0x18) != 1)) {
      local_4 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,0xe,
                           "Version %d not supported for deepscanline images in this version of the library"
                           ,*(undefined4 *)(*(long *)(lVar1 + 0x78) + 0x18));
    }
    else if (((*(long *)(lVar1 + 0x20) == 0) || (*(int *)(*(long *)(lVar1 + 0x20) + 0x14) != 3)) ||
            (**(int **)(*(long *)(lVar1 + 0x20) + 0x18) < 1)) {
      local_4 = 0xe;
    }
    else {
      local_4 = internal_coding_fill_channel_info
                          (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                           in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                           in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      if (local_4 == 0) {
        *(int *)((long)in_RCX + 0x14) = in_ESI;
        *(long *)((long)in_RCX + 0x18) = in_RDI;
        memcpy((void *)((long)in_RCX + 0x20),in_RDX,0x40);
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_decoding_initialize (
    exr_const_context_t     ctxt,
    int                     part_index,
    const exr_chunk_info_t* cinfo,
    exr_decode_pipeline_t*  decode)
{
    exr_result_t          rv;
    exr_decode_pipeline_t nil = {0};
    exr_const_priv_part_t part;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!cinfo || !decode)
        return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);

    if (part_index < 0 || part_index >= ctxt->num_parts)
        return EXR_ERR_ARGUMENT_OUT_OF_RANGE;

    part = ctxt->parts[part_index];

    *decode = nil;

    if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        if (part->version && part->version->i != 1)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ATTR,
                "Version %d not supported for deepscanline images in this version of the library",
                part->version->i);
        }
    }

    /* will have already been reported during header parse, but just
     * stop the file from being read
     */
    if (!part->channels || part->channels->type != EXR_ATTR_CHLIST ||
        part->channels->chlist->num_channels <= 0)
        return EXR_ERR_INVALID_ATTR;

    rv = internal_coding_fill_channel_info (
        &(decode->channels),
        &(decode->channel_count),
        decode->_quick_chan_store,
        cinfo,
        ctxt,
        part);

    if (rv == EXR_ERR_SUCCESS)
    {
        decode->part_index = part_index;
        decode->context    = ctxt;
        decode->chunk      = *cinfo;
    }
    return rv;
}